

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallFilesGenerator::AddFilesInstallRule
          (cmInstallFilesGenerator *this,ostream *os,string *config,Indent *indent,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  string local_48;
  
  GetDestination(&local_48,this,config);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_48,this->Programs | cmInstallType_FILES,files
             ,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
             (this->Rename)._M_dataplus._M_p,(char *)0x0,indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallFilesGenerator::AddFilesInstallRule(
  std::ostream& os,
  const std::string config,
  Indent const& indent,
  std::vector<std::string> const& files)
{
  // Write code to install the files.
  const char* no_dir_permissions = 0;
  this->AddInstallRule(os,
                       this->GetDestination(config),
                       (this->Programs
                        ? cmInstallType_PROGRAMS
                        : cmInstallType_FILES),
                       files,
                       this->Optional,
                       this->FilePermissions.c_str(), no_dir_permissions,
                       this->Rename.c_str(), 0, indent);
}